

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_reader.cc
# Opt level: O0

void __thiscall lf::io::GmshReader::InitGmshFile(GmshReader *this,GMshFileV2 *msh_file)

{
  allocator<bool> *this_00;
  allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *this_01;
  Entity *e_00;
  initializer_list<unsigned_int> __l;
  value_type *pvVar1;
  bool bVar2;
  RefElType RVar3;
  RefElType RVar4;
  uint uVar5;
  int iVar6;
  size_type sVar7;
  value_type vVar8;
  dim_t dVar9;
  uint uVar10;
  pointer pMVar11;
  runtime_error *prVar12;
  size_type sVar13;
  vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_> *this_02;
  reference pvVar14;
  reference pvVar15;
  ostream *poVar16;
  value_type *pvVar17;
  CoeffReturnType pdVar18;
  value_type *pvVar19;
  const_reference pvVar20;
  const_reference pvVar21;
  reference pvVar22;
  vector<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *this_03;
  const_reference pvVar23;
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  *this_04;
  element_type *peVar24;
  undefined4 extraout_var;
  reference ppEVar25;
  ulong uVar26;
  element_type *this_05;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_06;
  vector<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>
  *this_07;
  string *__x;
  int *__x_00;
  reference rVar27;
  byte local_11b1;
  uint local_108c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_1088;
  pair<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  local_1060;
  _Base_ptr local_1030;
  uint local_1024;
  pair<int,_unsigned_int> local_1020;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_unsigned_int>_>
  local_1018;
  reference local_ff0;
  PhysicalEntity *pe;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>
  *__range2_1;
  reference local_fc8;
  uint *gmsh_index;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> temp;
  size_type mi_1;
  Entity *e_1;
  iterator __end3;
  iterator __begin3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3;
  undefined1 local_f50 [4];
  dim_t c_1;
  shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_f40;
  shared_ptr<lf::mesh::Mesh> local_f30;
  allocator<unsigned_int> local_f1d;
  value_type local_f1c;
  iterator local_f18;
  size_type local_f10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f08;
  span<const_unsigned_int,_18446744073709551615UL> local_ef0;
  RefElType local_ed9;
  uint local_ed8;
  allocator<unsigned_int> local_ed1;
  dim_t i_3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> main_nodes;
  allocator<char> local_e91;
  string local_e90;
  allocator<char> local_e69;
  string local_e68;
  stringstream local_e48 [8];
  stringstream ss_4;
  ostream local_e38 [376];
  Type local_cc0;
  undefined1 local_c88 [15];
  RefEl local_c79;
  undefined1 local_c78 [15];
  RefEl local_c69;
  undefined1 local_c68 [15];
  RefEl local_c59;
  undefined1 local_c58 [15];
  RefEl local_c49;
  undefined1 local_c48 [15];
  RefEl local_c39;
  undefined1 local_c38 [15];
  RefEl local_c29;
  undefined1 local_c28 [15];
  RefEl local_c19;
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_c18;
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> geom;
  ColXpr local_bd8;
  Type local_ba0;
  undefined1 local_b68 [8];
  Matrix<double,_3,_1,_0,_3,_1> node_coord;
  Index i_2;
  MatrixXd node_coords;
  long num_nodes;
  RefEl local_b1d;
  value_type mesh_index;
  uint local_b18;
  RefEl local_b11;
  dim_t codim;
  RefEl ref_el_1;
  value_type *end_element;
  value_type *begin_element;
  size_t end;
  size_t begin;
  Type local_ae0;
  Matrix<double,__1,_1,_0,__1,_1> local_aa8;
  allocator<char> local_a91;
  string local_a90;
  allocator<char> local_a69;
  string local_a68;
  allocator<char> local_a41;
  string local_a40;
  string local_a20;
  allocator<char> local_9f9;
  string local_9f8;
  allocator<char> local_9d1;
  string local_9d0;
  stringstream local_9b0 [8];
  stringstream ss_3;
  ostream local_9a0 [380];
  value_type local_824;
  undefined1 auStack_820 [4];
  size_type mi;
  _Bit_type local_818;
  value_type_conflict3 local_80c;
  const_reference local_808;
  value_type *n;
  size_t i_1;
  undefined1 local_7f0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> gi2i;
  undefined1 local_7d0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> gi2mi;
  string local_7b0;
  allocator<char> local_789;
  string local_788;
  allocator<char> local_761;
  string local_760;
  string local_740;
  allocator<char> local_719;
  string local_718;
  allocator<char> local_6f1;
  string local_6f0;
  stringstream local_6d0 [8];
  stringstream ss_2;
  ostream local_6c0 [380];
  uint local_544;
  undefined1 auStack_540 [4];
  dim_t c;
  _Bit_type local_538;
  uint local_52c;
  uint local_528;
  value_type node_number;
  uint i;
  RefEl ref_el;
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460;
  stringstream local_440 [8];
  stringstream ss_1;
  ostream local_430 [376];
  reference local_2b8;
  Element *e;
  const_iterator __end2;
  const_iterator __begin2;
  vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_> *__range2;
  undefined1 local_290 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> num_entities;
  undefined1 local_270 [8];
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  mi2gi;
  undefined1 local_250 [8];
  vector<bool,_std::allocator<bool>_> is_main_node;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  uint local_20;
  uint local_1c;
  dim_t dim_world;
  dim_t dim_mesh;
  GMshFileV2 *msh_file_local;
  GmshReader *this_local;
  
  _dim_world = msh_file;
  msh_file_local = (GMshFileV2 *)this;
  pMVar11 = std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
            operator->(&this->mesh_factory_);
  local_1c = (*pMVar11->_vptr_MeshFactory[1])();
  pMVar11 = std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
            operator->(&this->mesh_factory_);
  local_20 = (**pMVar11->_vptr_MeshFactory)();
  if ((((local_1c < 2) || (3 < local_1c)) || (local_20 < 2)) || (3 < local_20)) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,"GmshReader supports only 2D and 3D meshes.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,
               "dim_mesh >= 2 && dim_mesh <= 3 && dim_world >= 2 && dim_world <= 3",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
               ,&local_201);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed
              (&local_1d8,&local_200,0x80,
               (string *)
               &is_main_node.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &is_main_node.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"this code should not be reached");
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar13 = std::
           vector<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
           ::size(&_dim_world->Nodes);
  mi2gi.
  super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  this_00 = (allocator<bool> *)
            ((long)&mi2gi.
                    super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
  std::allocator<bool>::allocator(this_00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_250,sVar13,
             (bool *)((long)&mi2gi.
                             super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),this_00);
  std::allocator<bool>::~allocator
            ((allocator<bool> *)
             ((long)&mi2gi.
                     super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  uVar5 = local_1c + 1;
  this_01 = (allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             *)((long)&num_entities.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::
  allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::allocator(this_01);
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
            *)local_270,(ulong)uVar5,this_01);
  std::
  allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                *)((long)&num_entities.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 7));
  pMVar11 = std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
            operator->(&this->mesh_factory_);
  iVar6 = (*pMVar11->_vptr_MeshFactory[1])();
  __range2._4_4_ = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&__range2 + 3));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_290,(ulong)(iVar6 + 1),
             (value_type_conflict3 *)((long)&__range2 + 4),
             (allocator<unsigned_int> *)((long)&__range2 + 3));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&__range2 + 3));
  this_02 = &_dim_world->Elements;
  __end2 = std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>::
           begin(this_02);
  e = (Element *)
      std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>::end
                (this_02);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_lf::io::GMshFileV2::Element_*,_std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_>
                      (&__end2,(__normal_iterator<const_lf::io::GMshFileV2::Element_*,_std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_>
                                *)&e);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    local_2b8 = __gnu_cxx::
                __normal_iterator<const_lf::io::GMshFileV2::Element_*,_std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_>
                ::operator*(&__end2);
    uVar5 = DimOf(local_2b8->Type);
    if (local_1c < uVar5) {
      std::__cxx11::stringstream::stringstream(local_440);
      poVar16 = std::operator<<(local_430,"mesh_factory->DimMesh() = ");
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_1c);
      poVar16 = std::operator<<(poVar16,", but msh-file contains entities with dimension ");
      iVar6 = DimOf(local_2b8->Type);
      std::ostream::operator<<(poVar16,iVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_460,"DimOf(e.Type) <= dim_mesh",&local_461);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_488,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                 ,&local_489);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_460,&local_488,0x99,&local_4b0);
      std::__cxx11::string::~string((string *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_488);
      std::allocator<char>::~allocator(&local_489);
      std::__cxx11::string::~string((string *)&local_460);
      std::allocator<char>::~allocator(&local_461);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"false",&local_4d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                 ,&local_4f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i,"",(allocator<char> *)((long)&node_number + 3));
      lf::base::AssertionFailed(&local_4d0,&local_4f8,0x99,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator((allocator<char> *)((long)&node_number + 3));
      std::__cxx11::string::~string((string *)&local_4f8);
      std::allocator<char>::~allocator(&local_4f9);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::allocator<char>::~allocator(&local_4d1);
      abort();
    }
    iVar6 = DimOf(local_2b8->Type);
    pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_290,
                         (long)iVar6);
    *pvVar15 = *pvVar15 + 1;
    if (local_2b8->Type != POINT) {
      node_number._2_1_ = RefElOf(local_2b8->Type);
      local_528 = 0;
      while( true ) {
        uVar5 = local_528;
        sVar7 = lf::base::RefEl::NumNodes((RefEl *)((long)&node_number + 2));
        if (sVar7 <= uVar5) break;
        pvVar21 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&local_2b8->NodeNumbers,(ulong)local_528);
        local_52c = *pvVar21;
        sVar13 = std::vector<bool,_std::allocator<bool>_>::size
                           ((vector<bool,_std::allocator<bool>_> *)local_250);
        if (sVar13 <= local_52c) {
          std::vector<bool,_std::allocator<bool>_>::resize
                    ((vector<bool,_std::allocator<bool>_> *)local_250,(ulong)(local_52c + 1),false);
        }
        rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_250,(ulong)local_52c);
        _auStack_540 = rVar27;
        std::_Bit_reference::operator=((_Bit_reference *)auStack_540,true);
        local_528 = local_528 + 1;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_lf::io::GMshFileV2::Element_*,_std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>_>
    ::operator++(&__end2);
  }
  for (local_544 = 0; local_544 <= local_1c; local_544 = local_544 + 1) {
    pvVar14 = std::
              vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
              ::operator[]((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                            *)local_270,(ulong)local_544);
    pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_290,
                         (ulong)(local_1c - local_544));
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::reserve(pvVar14,(ulong)*pvVar15);
  }
  pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_290,
                       (ulong)local_1c);
  if (*pvVar15 == 0) {
    std::__cxx11::stringstream::stringstream(local_6d0);
    poVar16 = std::operator<<(local_6c0,"MshFile contains no elements with dimension ");
    std::ostream::operator<<(poVar16,local_1c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6f0,"num_entities[dim_mesh] > 0",&local_6f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_718,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
               ,&local_719);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_6f0,&local_718,0xaf,&local_740);
    std::__cxx11::string::~string((string *)&local_740);
    std::__cxx11::string::~string((string *)&local_718);
    std::allocator<char>::~allocator(&local_719);
    std::__cxx11::string::~string((string *)&local_6f0);
    std::allocator<char>::~allocator(&local_6f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_760,"false",&local_761);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_788,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
               ,&local_789);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7b0,"",
               (allocator<char> *)
               ((long)&gi2mi.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    lf::base::AssertionFailed(&local_760,&local_788,0xaf,&local_7b0);
    std::__cxx11::string::~string((string *)&local_7b0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&gi2mi.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_788);
    std::allocator<char>::~allocator(&local_789);
    std::__cxx11::string::~string((string *)&local_760);
    std::allocator<char>::~allocator(&local_761);
    abort();
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_290);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7d0);
  sVar13 = std::vector<bool,_std::allocator<bool>_>::size
                     ((vector<bool,_std::allocator<bool>_> *)local_250);
  gi2i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7d0,sVar13,
             (value_type_conflict3 *)
             ((long)&gi2i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7f0);
  sVar13 = std::vector<bool,_std::allocator<bool>_>::size
                     ((vector<bool,_std::allocator<bool>_> *)local_250);
  i_1._4_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7f0,sVar13,
             (value_type_conflict3 *)((long)&i_1 + 4));
  n = (value_type *)0x0;
  while( true ) {
    pvVar1 = n;
    pvVar17 = (value_type *)
              std::
              vector<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              ::size(&_dim_world->Nodes);
    if (pvVar17 <= pvVar1) break;
    local_808 = std::
                vector<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                ::operator[](&_dim_world->Nodes,(size_type)n);
    sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7f0);
    if (sVar13 <= local_808->first) {
      local_80c = 0xffffffff;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7f0,
                 (ulong)(local_808->first + 1),&local_80c);
    }
    vVar8 = (value_type)n;
    pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7f0,
                         (ulong)local_808->first);
    *pvVar15 = vVar8;
    sVar13 = std::vector<bool,_std::allocator<bool>_>::size
                       ((vector<bool,_std::allocator<bool>_> *)local_250);
    local_11b1 = 1;
    if (local_808->first < sVar13) {
      rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_250,(ulong)local_808->first);
      _auStack_820 = rVar27;
      bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_820);
      local_11b1 = bVar2 ^ 0xff;
    }
    if ((local_11b1 & 1) == 0) {
      if (local_20 == 2) {
        pdVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)
                             &local_808->second,2);
        if ((*pdVar18 != 0.0) || (NAN(*pdVar18))) {
          std::__cxx11::stringstream::stringstream(local_9b0);
          std::operator<<(local_9a0,"In a 2D GmshMesh, the z-coordinate of every node must be zero")
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9d0,"n.second(2) == 0",&local_9d1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9f8,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                     ,&local_9f9);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_9d0,&local_9f8,0xcd,&local_a20);
          std::__cxx11::string::~string((string *)&local_a20);
          std::__cxx11::string::~string((string *)&local_9f8);
          std::allocator<char>::~allocator(&local_9f9);
          std::__cxx11::string::~string((string *)&local_9d0);
          std::allocator<char>::~allocator(&local_9d1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a40,"false",&local_a41);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a68,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                     ,&local_a69);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a90,"",&local_a91);
          lf::base::AssertionFailed(&local_a40,&local_a68,0xcd,&local_a90);
          std::__cxx11::string::~string((string *)&local_a90);
          std::allocator<char>::~allocator(&local_a91);
          std::__cxx11::string::~string((string *)&local_a68);
          std::allocator<char>::~allocator(&local_a69);
          std::__cxx11::string::~string((string *)&local_a40);
          std::allocator<char>::~allocator(&local_a41);
          abort();
        }
        pMVar11 = std::
                  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
                  operator->(&this->mesh_factory_);
        Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::topRows<int>
                  (&local_ae0,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_808->second
                   ,2);
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,_1,1,false>>
                  ((Matrix<double,_1,1,0,_1,1> *)&local_aa8,
                   (EigenBase<Eigen::Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_>
                    *)&local_ae0);
        local_824 = (*pMVar11->_vptr_MeshFactory[2])(pMVar11,&local_aa8);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_aa8);
      }
      else {
        pMVar11 = std::
                  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
                  operator->(&this->mesh_factory_);
        Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,3,1,0,3,1>>
                  ((Matrix<double,_1,1,0,_1,1> *)&begin,
                   (EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_808->second);
        local_824 = (*pMVar11->_vptr_MeshFactory[2])(pMVar11,&begin);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&begin);
      }
      vVar8 = local_824;
      pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7d0,
                           (ulong)local_808->first);
      *pvVar15 = vVar8;
    }
    n = (value_type *)((long)&n->first + 1);
  }
  end = 0;
  begin_element = (value_type *)0x0;
  while( true ) {
    pvVar19 = (value_type *)
              std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>
              ::size(&_dim_world->Elements);
    if (pvVar19 <= begin_element) break;
    pvVar20 = std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>
              ::operator[](&_dim_world->Elements,end);
    _codim = std::vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>
             ::operator[](&_dim_world->Elements,(size_type)begin_element);
    local_b11 = RefElOf(_codim->Type);
    uVar5 = local_1c;
    dVar9 = lf::base::RefEl::Dimension(&local_b11);
    local_b18 = uVar5 - dVar9;
    bVar2 = std::operator==(&pvVar20->NodeNumbers,&_codim->NodeNumbers);
    if (((bVar2) && ((value_type *)end != begin_element)) && (pvVar20->Type == _codim->Type)) {
      pvVar14 = std::
                vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                ::operator[]((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                              *)local_270,(ulong)local_b18);
      pvVar22 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::back(pvVar14);
      mesh_index = (value_type)begin_element;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar22,&mesh_index);
    }
    else {
      end = (size_t)begin_element;
      RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_b11);
      local_b1d = lf::base::RefEl::kPoint();
      RVar4 = lf::base::RefEl::operator_cast_to_RefElType(&local_b1d);
      if (RVar3 == RVar4) {
        pvVar21 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&_codim->NodeNumbers,0);
        pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7d0,
                             (ulong)*pvVar21);
        uVar5 = *pvVar15;
        num_nodes._4_4_ = uVar5;
        uVar10 = std::numeric_limits<unsigned_int>::max();
        if (uVar5 != uVar10) {
          pvVar14 = std::
                    vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                  *)local_270,(ulong)local_1c);
          sVar13 = std::
                   vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ::size(pvVar14);
          if (sVar13 <= num_nodes._4_4_) {
            pvVar14 = std::
                      vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                      ::operator[]((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                    *)local_270,(ulong)local_1c);
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::resize(pvVar14,(ulong)(num_nodes._4_4_ + 1));
          }
          pvVar14 = std::
                    vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                  *)local_270,(ulong)local_1c);
          pvVar22 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[](pvVar14,(ulong)num_nodes._4_4_);
          num_nodes._0_4_ = (value_type)begin_element;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (pvVar22,(value_type_conflict3 *)&num_nodes);
        }
      }
      else {
        sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           (&_codim->NodeNumbers);
        node_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols = lf::base::narrow<long,unsigned_long>(sVar13);
        Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_int,long>
                  ((Matrix<double,_1,_1,0,_1,_1> *)&i_2,&local_20,
                   &node_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols);
        for (node_coord.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[2] = 0.0;
            (long)node_coord.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2] <
            node_coords.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols; node_coord.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2] =
                         (double)((long)node_coord.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                        .m_storage.m_data.array[2] + 1)) {
          this_03 = &_dim_world->Nodes;
          pvVar21 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&_codim->NodeNumbers,
                               (size_type)
                               node_coord.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[2]);
          pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7f0,
                               (ulong)*pvVar21);
          pvVar23 = std::
                    vector<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                    ::operator[](this_03,(ulong)*pvVar15);
          Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                    ((Matrix<double,_3,_1,_0,_3,_1> *)local_b68,&pvVar23->second);
          if (local_20 == 2) {
            Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::topRows<int>
                      (&local_ba0,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_b68,2);
            Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                      (&local_bd8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&i_2,
                       (Index)node_coord.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array[2]);
            Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
                      ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&local_bd8,
                       (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false>_>
                        *)&local_ba0);
          }
          else {
            Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                      ((ColXpr *)&geom,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&i_2,
                       (Index)node_coord.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array[2]);
            Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
                      ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&geom,
                       (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_b68);
          }
        }
        std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
        unique_ptr<std::default_delete<lf::geometry::Geometry>,void>
                  ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *
                   )&local_c18);
        switch(_codim->Type) {
        case EDGE2:
          local_c19 = lf::base::RefEl::kSegment();
          lf::base::RefEl::operator=(&local_b11,&local_c19);
          std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_c28);
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          operator=((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_c18,
                    (unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                     *)local_c28);
          std::unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>::
          ~unique_ptr((unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                       *)local_c28);
          break;
        case TRIA3:
          local_c39 = lf::base::RefEl::kTria();
          lf::base::RefEl::operator=(&local_b11,&local_c39);
          std::make_unique<lf::geometry::TriaO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_c48);
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          operator=((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_c18,
                    (unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *)
                    local_c48);
          std::unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>::
          ~unique_ptr((unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>
                       *)local_c48);
          break;
        case QUAD4:
          local_c59 = lf::base::RefEl::kQuad();
          lf::base::RefEl::operator=(&local_b11,&local_c59);
          std::make_unique<lf::geometry::QuadO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_c68);
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          operator=((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_c18,
                    (unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_> *)
                    local_c68);
          std::unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_>::
          ~unique_ptr((unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_>
                       *)local_c68);
          break;
        default:
          std::__cxx11::stringstream::stringstream(local_e48);
          poVar16 = std::operator<<(local_e38,"Gmsh element type ");
          poVar16 = io::operator<<(poVar16,_codim->Type);
          std::operator<<(poVar16," not (yet) supported by GmshReader.");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e68,"false",&local_e69);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e90,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                     ,&local_e91);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed
                    (&local_e68,&local_e90,0x122,
                     (string *)
                     &main_nodes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string
                    ((string *)
                     &main_nodes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string((string *)&local_e90);
          std::allocator<char>::~allocator(&local_e91);
          std::__cxx11::string::~string((string *)&local_e68);
          std::allocator<char>::~allocator(&local_e69);
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar12,"this code should not be reached");
          __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        case EDGE3:
          local_c29 = lf::base::RefEl::kSegment();
          lf::base::RefEl::operator=(&local_b11,&local_c29);
          std::make_unique<lf::geometry::SegmentO2,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_c38);
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          operator=((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_c18,
                    (unique_ptr<lf::geometry::SegmentO2,_std::default_delete<lf::geometry::SegmentO2>_>
                     *)local_c38);
          std::unique_ptr<lf::geometry::SegmentO2,_std::default_delete<lf::geometry::SegmentO2>_>::
          ~unique_ptr((unique_ptr<lf::geometry::SegmentO2,_std::default_delete<lf::geometry::SegmentO2>_>
                       *)local_c38);
          break;
        case TRIA6:
          local_c49 = lf::base::RefEl::kTria();
          lf::base::RefEl::operator=(&local_b11,&local_c49);
          std::make_unique<lf::geometry::TriaO2,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_c58);
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          operator=((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_c18,
                    (unique_ptr<lf::geometry::TriaO2,_std::default_delete<lf::geometry::TriaO2>_> *)
                    local_c58);
          std::unique_ptr<lf::geometry::TriaO2,_std::default_delete<lf::geometry::TriaO2>_>::
          ~unique_ptr((unique_ptr<lf::geometry::TriaO2,_std::default_delete<lf::geometry::TriaO2>_>
                       *)local_c58);
          break;
        case QUAD9:
          local_c79 = lf::base::RefEl::kQuad();
          lf::base::RefEl::operator=(&local_b11,&local_c79);
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::leftCols<int>
                    (&local_cc0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&i_2,8);
          std::
          make_unique<lf::geometry::QuadO2,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>>
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true> *)local_c88);
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          operator=((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_c18,
                    (unique_ptr<lf::geometry::QuadO2,_std::default_delete<lf::geometry::QuadO2>_> *)
                    local_c88);
          std::unique_ptr<lf::geometry::QuadO2,_std::default_delete<lf::geometry::QuadO2>_>::
          ~unique_ptr((unique_ptr<lf::geometry::QuadO2,_std::default_delete<lf::geometry::QuadO2>_>
                       *)local_c88);
          break;
        case QUAD8:
          local_c69 = lf::base::RefEl::kQuad();
          lf::base::RefEl::operator=(&local_b11,&local_c69);
          std::make_unique<lf::geometry::QuadO2,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_c78);
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          operator=((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                     *)&local_c18,
                    (unique_ptr<lf::geometry::QuadO2,_std::default_delete<lf::geometry::QuadO2>_> *)
                    local_c78);
          std::unique_ptr<lf::geometry::QuadO2,_std::default_delete<lf::geometry::QuadO2>_>::
          ~unique_ptr((unique_ptr<lf::geometry::QuadO2,_std::default_delete<lf::geometry::QuadO2>_>
                       *)local_c78);
        }
        sVar7 = lf::base::RefEl::NumNodes(&local_b11);
        std::allocator<unsigned_int>::allocator(&local_ed1);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_3,(ulong)sVar7,
                   &local_ed1);
        std::allocator<unsigned_int>::~allocator(&local_ed1);
        local_ed8 = 0;
        while( true ) {
          uVar5 = local_ed8;
          sVar7 = lf::base::RefEl::NumNodes(&local_b11);
          if (sVar7 <= uVar5) break;
          pvVar21 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&_codim->NodeNumbers,(ulong)local_ed8);
          pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7d0,
                               (ulong)*pvVar21);
          vVar8 = *pvVar15;
          pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_3,
                               (ulong)local_ed8);
          *pvVar15 = vVar8;
          local_ed8 = local_ed8 + 1;
        }
        pMVar11 = std::
                  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
                  operator->(&this->mesh_factory_);
        local_ed9 = local_b11.type_;
        std::span<const_unsigned_int,_18446744073709551615UL>::
        span<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>
                  (&local_ef0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_3);
        (*pMVar11->_vptr_MeshFactory[4])(pMVar11,(ulong)local_ed9,&local_ef0,&local_c18);
        this_04 = (vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                   *)std::
                     vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                     ::operator[]((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                   *)local_270,(ulong)local_b18);
        local_f1c = (value_type)begin_element;
        local_f18 = &local_f1c;
        local_f10 = 1;
        std::allocator<unsigned_int>::allocator(&local_f1d);
        __l._M_len = local_f10;
        __l._M_array = local_f18;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_f08,__l,&local_f1d);
        std::
        vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
        ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>(this_04,&local_f08);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_f08);
        std::allocator<unsigned_int>::~allocator(&local_f1d);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_3);
        std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
        ~unique_ptr(&local_c18);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)&i_2)
        ;
      }
    }
    begin_element = (value_type *)((long)&begin_element->Number + 1);
  }
  pMVar11 = std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::
            operator->(&this->mesh_factory_);
  (*pMVar11->_vptr_MeshFactory[5])(&local_f30);
  std::shared_ptr<lf::mesh::Mesh>::operator=(&this->mesh_,&local_f30);
  std::shared_ptr<lf::mesh::Mesh>::~shared_ptr(&local_f30);
  std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
            ((shared_ptr<lf::mesh::Mesh_const> *)local_f50,&this->mesh_);
  lf::mesh::utils::make_AllCodimMeshDataSet<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((utils *)&local_f40,(shared_ptr<const_lf::mesh::Mesh> *)local_f50);
  std::
  shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator=(&this->physical_nrs_,&local_f40);
  std::
  shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~shared_ptr(&local_f40);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr((shared_ptr<const_lf::mesh::Mesh> *)local_f50);
  __range3._4_4_ = 0;
  do {
    if (local_1c < __range3._4_4_) {
      this_07 = &_dim_world->PhysicalEntities;
      __end2_1 = std::
                 vector<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>
                 ::begin(this_07);
      pe = (PhysicalEntity *)
           std::
           vector<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>
           ::end(this_07);
      while( true ) {
        bVar2 = __gnu_cxx::
                operator==<const_lf::io::GMshFileV2::PhysicalEntity_*,_std::vector<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>_>
                          (&__end2_1,
                           (__normal_iterator<const_lf::io::GMshFileV2::PhysicalEntity_*,_std::vector<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>_>
                            *)&pe);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        local_ff0 = __gnu_cxx::
                    __normal_iterator<const_lf::io::GMshFileV2::PhysicalEntity_*,_std::vector<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>_>
                    ::operator*(&__end2_1);
        __x = &local_ff0->Name;
        local_1024 = local_1c - local_ff0->Dimension;
        std::pair<int,_unsigned_int>::pair<unsigned_int,_true>
                  (&local_1020,&local_ff0->Number,&local_1024);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_unsigned_int>_>
        ::pair<std::pair<int,_unsigned_int>,_true>(&local_1018,__x,&local_1020);
        local_1030 = (_Base_ptr)
                     std::
                     multimap<std::__cxx11::string,std::pair<unsigned_int,unsigned_int>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>>
                     ::insert<std::pair<std::__cxx11::string,std::pair<int,unsigned_int>>>
                               ((multimap<std::__cxx11::string,std::pair<unsigned_int,unsigned_int>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>>
                                 *)&this->name_2_nr_,&local_1018);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_unsigned_int>_>
        ::~pair(&local_1018);
        __x_00 = &local_ff0->Number;
        local_108c = local_1c - local_ff0->Dimension;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
        ::pair<unsigned_int,_true>(&local_1088,&local_ff0->Name,&local_108c);
        std::
        pair<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
        ::
        pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                  (&local_1060,__x_00,&local_1088);
        std::
        multimap<unsigned_int,std::pair<std::__cxx11::string,unsigned_int>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>>>
        ::insert<std::pair<int,std::pair<std::__cxx11::string,unsigned_int>>>
                  ((multimap<unsigned_int,std::pair<std::__cxx11::string,unsigned_int>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>>>
                    *)&this->nr_2_name_,&local_1060);
        std::
        pair<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
        ::~pair(&local_1060);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
        ::~pair(&local_1088);
        __gnu_cxx::
        __normal_iterator<const_lf::io::GMshFileV2::PhysicalEntity_*,_std::vector<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>_>
        ::operator++(&__end2_1);
      }
      std::
      vector<lf::io::GMshFileV2::PeriodicEntity,_std::allocator<lf::io::GMshFileV2::PeriodicEntity>_>
      ::empty(&_dim_world->Periodic);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7f0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7d0);
      std::
      vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
      ::~vector((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                 *)local_270);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_250);
      return;
    }
    peVar24 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    iVar6 = (*peVar24->_vptr_Mesh[2])(peVar24,(ulong)__range3._4_4_);
    __begin3._M_current = (Entity **)CONCAT44(extraout_var,iVar6);
    __end3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
    e_1 = (Entity *)
          std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                    ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                        (&__end3,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                  *)&e_1);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      ppEVar25 = __gnu_cxx::
                 __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                 ::operator*(&__end3);
      e_00 = *ppEVar25;
      peVar24 = std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
      temp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (*peVar24->_vptr_Mesh[5])(peVar24,e_00);
      if (__range3._4_4_ == local_1c) {
        uVar26 = (ulong)temp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage._4_4_;
        pvVar14 = std::
                  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                  ::operator[]((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                *)local_270,(ulong)local_1c);
        sVar13 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::size(pvVar14);
        if (uVar26 < sVar13) goto LAB_002375e2;
      }
      else {
LAB_002375e2:
        pvVar14 = std::
                  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                  ::operator[]((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                *)local_270,(ulong)__range3._4_4_);
        sVar13 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::size(pvVar14);
        if (temp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ < sVar13) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range5);
          pvVar14 = std::
                    vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                    ::operator[]((vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                  *)local_270,(ulong)__range3._4_4_);
          pvVar22 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[](pvVar14,(ulong)temp.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                                _4_4_);
          __end5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar22);
          gmsh_index = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                         (pvVar22);
          while( true ) {
            bVar2 = __gnu_cxx::
                    operator==<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              (&__end5,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                        *)&gmsh_index);
            if (((bVar2 ^ 0xffU) & 1) == 0) break;
            local_fc8 = __gnu_cxx::
                        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator*(&__end5);
            pvVar20 = std::
                      vector<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>
                      ::operator[](&_dim_world->Elements,(ulong)*local_fc8);
            __range2_1._4_4_ = pvVar20->PhysicalEntityNr;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range5,
                       (value_type_conflict3 *)((long)&__range2_1 + 4));
            __gnu_cxx::
            __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator++(&__end5);
          }
          this_05 = std::
                    __shared_ptr_access<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->physical_nrs_);
          this_06 = lf::mesh::utils::
                    AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                    operator()(this_05,e_00);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (this_06,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range5);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range5);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end3);
    }
    __range3._4_4_ = __range3._4_4_ + 1;
  } while( true );
}

Assistant:

void GmshReader::InitGmshFile(const GMshFileV2& msh_file) {
  // 1) Check Gmsh_file and initialize
  //////////////////////////////////////////////////////////////////////////

  const dim_t dim_mesh = mesh_factory_->DimMesh();
  const dim_t dim_world = mesh_factory_->DimWorld();
  LF_VERIFY_MSG(
      dim_mesh >= 2 && dim_mesh <= 3 && dim_world >= 2 && dim_world <= 3,
      "GmshReader supports only 2D and 3D meshes.");

  // 1) Determine which nodes of gmsh are also nodes of the LehrFEM++ mesh +
  // count number of entities of each codimension (exclude auxilliary nodes).
  // This is necessary because e.g. second order meshes in gmsh need a lot of
  // auxilliary nodes to define their geometry...
  /////////////////////////////////////////////////////////////////////////////
  // is_main_node[i] = true means that gmsh-node i is one of the main nodes of
  // an element
  std::vector<bool> is_main_node(msh_file.Nodes.size(), false);

  // mi2gi = mesh_index_2_gmsh_index
  // mi2gi[c][i] contains the gmsh entities that belong to the mesh entity with
  //             codim = c and mesh index i.
  std::vector<std::vector<std::vector<size_type>>> mi2gi(dim_mesh + 1);

  {
    // count the number of entities for each codimension and reserve space:
    std::vector<size_type> num_entities(mesh_factory_->DimMesh() + 1, 0);

    for (const auto& e : msh_file.Elements) {
      LF_ASSERT_MSG(DimOf(e.Type) <= dim_mesh,
                    "mesh_factory->DimMesh() = "
                        << dim_mesh
                        << ", but msh-file contains entities with dimension "
                        << DimOf(e.Type));

      ++num_entities[DimOf(e.Type)];

      if (e.Type != GMshFileV2::ElementType::POINT) {
        // mark main nodes
        auto ref_el = RefElOf(e.Type);
        for (unsigned int i = 0; i < ref_el.NumNodes(); ++i) {
          auto node_number = e.NodeNumbers[i];
          if (is_main_node.size() <= node_number) {
            is_main_node.resize(node_number + 1);
          }
          is_main_node[node_number] = true;
        }
      }
    }

    for (dim_t c = 0; c <= dim_mesh; ++c) {
      mi2gi[c].reserve(num_entities[dim_mesh - c]);
    }

    LF_ASSERT_MSG(num_entities[dim_mesh] > 0,
                  "MshFile contains no elements with dimension " << dim_mesh);
  }

  // 2) Insert main nodes into MeshFactory
  /////////////////////////////////////////////////////////////////////////////

  // gmsh_index_2_mesh_index for nodes:
  // gi2mi[i] = j means that gmsh node with gmsh index i has mesh index j
  std::vector<size_type> gi2mi;
  gi2mi.resize(is_main_node.size(), -1);

  // gi2i[i] = j implies msh_file.Nodes[j].first = i
  std::vector<size_type> gi2i;
  gi2i.resize(is_main_node.size(), -1);

  for (std::size_t i = 0; i < msh_file.Nodes.size(); ++i) {
    const auto& n = msh_file.Nodes[i];
    if (gi2i.size() <= n.first) {
      gi2i.resize(n.first + 1, -1);
    }
    gi2i[n.first] = i;

    if (is_main_node.size() <= n.first || !is_main_node[n.first]) {
      continue;
    }

    size_type mi;
    if (dim_world == 2) {
      LF_ASSERT_MSG(
          n.second(2) == 0,
          "In a 2D GmshMesh, the z-coordinate of every node must be zero");
      mi = mesh_factory_->AddPoint(n.second.topRows(2));
    } else {
      mi = mesh_factory_->AddPoint(n.second);
    }
    gi2mi[n.first] = mi;
  }

  // 3) Insert entities (except nodes) into MeshFactory:
  //////////////////////////////////////////////////////////////////////////////

  std::size_t begin = 0;
  for (std::size_t end = 0; end < msh_file.Elements.size(); ++end) {
    const auto& begin_element = msh_file.Elements[begin];
    const auto& end_element = msh_file.Elements[end];
    auto ref_el = RefElOf(end_element.Type);
    auto codim = dim_mesh - ref_el.Dimension();
    if (begin_element.NodeNumbers == end_element.NodeNumbers && begin != end &&
        begin_element.Type == end_element.Type) {
      // This entity appears more than once
      mi2gi[codim].back().push_back(end);
      continue;
    }

    begin = end;
    if (ref_el == base::RefEl::kPoint()) {
      auto mesh_index = gi2mi[end_element.NodeNumbers[0]];
      // check that this node is a main node (auxilliary nodes are not inserted
      // into the mesh!):
      if (mesh_index != std::numeric_limits<unsigned int>::max()) {
        // special case, this entity is a point (which has already been
        // inserted)
        if (mi2gi[dim_mesh].size() <= mesh_index) {
          mi2gi[dim_mesh].resize(mesh_index + 1);
        }
        mi2gi[dim_mesh][mesh_index].push_back(end);
      }
    } else {
      // gmsh element is not a point -> insert entity:
      auto num_nodes =
          base::narrow<Eigen::Index>(end_element.NodeNumbers.size());
      Eigen::MatrixXd node_coords(dim_world, num_nodes);
      for (Eigen::Index i = 0; i < num_nodes; ++i) {
        auto node_coord =
            msh_file.Nodes[gi2i[end_element.NodeNumbers[i]]].second;
        if (dim_world == 2) {
          node_coords.col(i) = node_coord.topRows(2);
        } else {
          node_coords.col(i) = node_coord;
        }
      }
      std::unique_ptr<geometry::Geometry> geom;

      switch (end_element.Type) {
        case GMshFileV2::ElementType::EDGE2:
          ref_el = base::RefEl::kSegment();
          geom = std::make_unique<geometry::SegmentO1>(node_coords);
          break;
        case GMshFileV2::ElementType::EDGE3:
          ref_el = base::RefEl::kSegment();
          geom = std::make_unique<geometry::SegmentO2>(node_coords);
          break;
        case GMshFileV2::ElementType::TRIA3:
          ref_el = base::RefEl::kTria();
          geom = std::make_unique<geometry::TriaO1>(node_coords);
          break;
        case GMshFileV2::ElementType::TRIA6:
          ref_el = base::RefEl::kTria();
          geom = std::make_unique<geometry::TriaO2>(node_coords);
          break;
        case GMshFileV2::ElementType::QUAD4:
          ref_el = base::RefEl::kQuad();
          geom = std::make_unique<geometry::QuadO1>(node_coords);
          break;
        case GMshFileV2::ElementType::QUAD8:
          ref_el = base::RefEl::kQuad();
          geom = std::make_unique<geometry::QuadO2>(node_coords);
          break;
        case GMshFileV2::ElementType::QUAD9:
          ref_el = base::RefEl::kQuad();
          geom = std::make_unique<geometry::QuadO2>(node_coords.leftCols(8));
          break;
        default:
          LF_VERIFY_MSG(false, "Gmsh element type "
                                   << end_element.Type
                                   << " not (yet) supported by GmshReader.");
      }
      std::vector<size_type> main_nodes(ref_el.NumNodes());
      for (dim_t i = 0; i < ref_el.NumNodes(); ++i) {
        main_nodes[i] = gi2mi[end_element.NodeNumbers[i]];
      }

      mesh_factory_->AddEntity(ref_el, main_nodes, std::move(geom));
      mi2gi[codim].emplace_back(std::vector{static_cast<unsigned int>(end)});
    }
  }

  // 4) Construct mesh
  //////////////////////////////////////////////////////////////////////////////
  mesh_ = mesh_factory_->Build();

  // 5) Build MeshDataSet that assigns the physical entitiies:
  //////////////////////////////////////////////////////////////////////////////
  physical_nrs_ =
      mesh::utils::make_AllCodimMeshDataSet<std::vector<size_type>>(mesh_);

  for (dim_t c = 0; c <= dim_mesh; ++c) {
    for (const auto* const e : mesh_->Entities(c)) {
      auto mi = mesh_->Index(*e);
      if (c == dim_mesh && mi >= mi2gi[dim_mesh].size()) {
        // this point did not appear as a gmsh element in the file -> don't
        // assign any physical entity nr.
        continue;
      }
      if (mi2gi[c].size() > mi) {
        std::vector<size_type> temp;
        for (auto& gmsh_index : mi2gi[c][mi]) {
          temp.push_back(msh_file.Elements[gmsh_index].PhysicalEntityNr);
        }

        physical_nrs_->operator()(*e) = std::move(temp);
      }
    }
  }

  // 6) Create mapping physicalEntityNr <-> physicalEntityName:
  //////////////////////////////////////////////////////////////////////////

  for (const auto& pe : msh_file.PhysicalEntities) {
    name_2_nr_.insert(
        std::pair{pe.Name, std::pair{pe.Number, dim_mesh - pe.Dimension}});
    nr_2_name_.insert(
        std::pair{pe.Number, std::pair{pe.Name, dim_mesh - pe.Dimension}});
  }

  if (!msh_file.Periodic.empty()) {
    /*LOGGER_ENTRY(logger_,
                 "WARNING: GMSH File  contains periodic boundary relations "
                 "between elements. These are ignored by GmshReader.",
                 3);*/
  }
}